

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirWatcherGeneric.cpp
# Opt level: O0

void __thiscall efsw::DirWatcherGeneric::removeDirectory(DirWatcherGeneric *this,string *dir)

{
  DirWatcherGeneric *this_00;
  bool bVar1;
  pointer ppVar2;
  _Self local_88;
  _Base_ptr local_80;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>
  local_78;
  iterator dit;
  DirWatcherGeneric *dw;
  string local_58 [32];
  FileSystem local_38 [32];
  string *local_18;
  string *dir_local;
  DirWatcherGeneric *this_local;
  
  local_18 = dir;
  dir_local = (string *)this;
  FileSystem::dirRemoveSlashAtEnd(dir);
  std::__cxx11::string::string(local_58,(string *)dir);
  FileSystem::fileNameFromPath(local_38,(string *)local_58);
  std::__cxx11::string::operator=((string *)dir,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string(local_58);
  dit._M_node = (_Base_ptr)0x0;
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>
  ::_Rb_tree_iterator(&local_78);
  local_80 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>_>
             ::find(&this->Directories,dir);
  local_78._M_node = local_80;
  local_88._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>_>
       ::end(&this->Directories);
  bVar1 = std::operator!=(&local_78,&local_88);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>
             ::operator->(&local_78);
    this_00 = ppVar2->second;
    this_00->Deleted = true;
    dit._M_node = (_Base_ptr)this_00;
    if (this_00 != (DirWatcherGeneric *)0x0) {
      if (this_00 != (DirWatcherGeneric *)0x0) {
        ~DirWatcherGeneric(this_00);
        operator_delete(this_00);
      }
      dit._M_node = (_Base_ptr)0x0;
    }
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>
             ::operator->(&local_78);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>_>
    ::erase(&this->Directories,&ppVar2->first);
  }
  return;
}

Assistant:

void DirWatcherGeneric::removeDirectory( std::string dir ) {
	FileSystem::dirRemoveSlashAtEnd( dir );
	dir = FileSystem::fileNameFromPath( dir );

	DirWatcherGeneric* dw = NULL;
	DirWatchMap::iterator dit;

	/// Folder deleted

	/// Search the folder, it should exists
	dit = Directories.find( dir );

	if ( dit != Directories.end() ) {
		dw = dit->second;

		/// Flag it as deleted so it fire the event for every file inside deleted
		dw->Deleted = true;

		/// Delete the DirWatcherGeneric
		efSAFE_DELETE( dw );

		/// Remove the directory from the map
		Directories.erase( dit->first );
	}
}